

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_cure_blindness(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  void *arg2;
  CHAR_DATA *ch_00;
  char *pcVar2;
  int type;
  
  bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_blindness);
  if (!bVar1) {
    bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_blindness_dust);
    if (!bVar1) {
      bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_blinding_orb);
      if (!bVar1) {
        if ((CHAR_DATA *)vo == ch) {
          pcVar2 = "You aren\'t blind.\n\r";
          goto LAB_00305f42;
        }
        pcVar2 = "$N doesn\'t appear to be blinded.";
        type = 3;
        arg2 = vo;
        vo = ch;
        goto LAB_00305f2e;
      }
    }
  }
  bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_blindness_dust);
  if (bVar1) {
    bVar1 = check_dispel(level,(CHAR_DATA *)vo,(int)gsn_blindness_dust);
    if (bVar1) {
      act("The dust in $n\'s eyes fades away.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
      bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_blindness);
      if (!bVar1) {
        return;
      }
    }
  }
  bVar1 = check_dispel(level,(CHAR_DATA *)vo,(int)gsn_blindness);
  if (bVar1) {
    send_to_char("Your vision returns!\n\r",(CHAR_DATA *)vo);
    act("$n is no longer blinded.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
  }
  else {
    bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_blindness);
    if (bVar1) {
      bVar1 = is_npc(ch);
      if ((bVar1) && ((ch->act[0] & 0x4000000) != 0)) {
        switchD_00333f01::default((CHAR_DATA *)vo,(int)gsn_blindness);
        pcVar2 = "Your vision returns!\n\r";
        ch_00 = (CHAR_DATA *)vo;
      }
      else {
        pcVar2 = "Spell failed.\n\r";
        ch_00 = ch;
      }
      send_to_char(pcVar2,ch_00);
    }
  }
  bVar1 = check_dispel(level,(CHAR_DATA *)vo,(int)gsn_blinding_orb);
  if (!bVar1) {
    pcVar2 = "Spell failed.\n\r";
LAB_00305f42:
    send_to_char(pcVar2,ch);
    return;
  }
  pcVar2 = "$n is no longer blinded.";
  type = 0;
  arg2 = (void *)0x0;
LAB_00305f2e:
  act(pcVar2,(CHAR_DATA *)vo,(void *)0x0,arg2,type);
  return;
}

Assistant:

void spell_cure_blindness(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;

	if (!is_affected(victim, gsn_blindness)
		&& !is_affected(victim, gsn_blindness_dust)
		&& !is_affected(victim, gsn_blinding_orb))
	{
		if (victim == ch)
			send_to_char("You aren't blind.\n\r", ch);
		else
			act("$N doesn't appear to be blinded.", ch, nullptr, victim, TO_CHAR);

		return;
	}

	if (is_affected(victim, gsn_blindness_dust))
	{
		if (check_dispel(level, victim, gsn_blindness_dust))
		{
			act("The dust in $n's eyes fades away.", victim, 0, 0, TO_ROOM);

			if (!is_affected(victim, gsn_blindness))
				return;
		}
	}

	if (check_dispel(level, victim, gsn_blindness))
	{
		send_to_char("Your vision returns!\n\r", victim);
		act("$n is no longer blinded.", victim, nullptr, nullptr, TO_ROOM);
	}
	else if (is_affected(victim, gsn_blindness))
	{
		if (is_npc(ch) && IS_SET(ch->act, ACT_IS_HEALER))
		{
			affect_strip(victim, gsn_blindness);
			send_to_char("Your vision returns!\n\r", victim);
		}
		else
		{
			send_to_char("Spell failed.\n\r", ch);
		}
	}

	if (check_dispel(level, victim, gsn_blinding_orb))
	{
		act("$n is no longer blinded.", victim, nullptr, nullptr, TO_ROOM);
	}
	else
	{
		send_to_char("Spell failed.\n\r", ch);
	}
}